

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O0

void __thiscall
HighsSparseVectorSum::
cleanup<HighsLpRelaxation::computeBasicDegenerateDuals(double,HighsDomain*)::__0>
          (HighsSparseVectorSum *this,anon_class_8_1_ba1d4488 *isZero)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference __b;
  anon_class_8_1_ba1d4488 *in_RSI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  double val;
  HighsInt pos;
  HighsInt i;
  HighsInt numNz;
  HighsCDouble local_38;
  double in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_18;
  int local_14;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
  local_14 = (int)sVar2;
  local_18 = local_14;
  while (local_18 = local_18 + -1, -1 < local_18) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_18);
    in_stack_ffffffffffffffe4 = *pvVar3;
    pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       (in_RDI,(long)in_stack_ffffffffffffffe4);
    in_stack_ffffffffffffffd8 = HighsCDouble::operator_cast_to_double(pvVar4);
    bVar1 = HighsLpRelaxation::computeBasicDegenerateDuals::anon_class_8_1_ba1d4488::operator()
                      (in_RSI,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
    if (bVar1) {
      HighsCDouble::HighsCDouble(&local_38,0.0);
      pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI,(long)in_stack_ffffffffffffffe4);
      pvVar4->hi = local_38.hi;
      pvVar4->lo = local_38.lo;
      local_14 = local_14 + -1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_14);
      __b = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 1),(long)local_18);
      std::swap<int>(pvVar3,__b);
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (size_type)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void cleanup(IsZero&& isZero) {
    HighsInt numNz = nonzeroinds.size();

    for (HighsInt i = numNz - 1; i >= 0; --i) {
      HighsInt pos = nonzeroinds[i];
      double val = double(values[pos]);

      if (isZero(pos, val)) {
        values[pos] = 0.0;
        --numNz;
        std::swap(nonzeroinds[numNz], nonzeroinds[i]);
      }
    }

    nonzeroinds.resize(numNz);
  }